

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O1

string * gmlc::networking::getLocalExternalAddressV6(string *__return_storage_ptr__,string *server)

{
  size_type *psVar1;
  undefined8 *puVar2;
  size_type sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long lVar7;
  int family;
  undefined8 uVar8;
  ulong uVar9;
  undefined1 *puVar10;
  ulong uVar11;
  _Alloc_hider _Var12;
  undefined1 *puVar13;
  bool bVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ndef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  candidate_addresses;
  string sstring;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resolved_addresses;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  query query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  query query_server;
  resolver resolver;
  string local_288;
  string *local_260;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  string local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  size_type sStack_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1b8 [2];
  _Head_base<0UL,_asio::io_context_*,_false> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  pointer pcStack_100;
  undefined1 local_f0 [48];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_80;
  
  local_f0._8_8_ = 0;
  local_f0[0x10] = '\0';
  local_f0._0_8_ = local_f0 + 0x10;
  AsioContextManager::getContextPointer((AsioContextManager *)local_1d8,(string *)local_f0);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,CONCAT71(local_f0._17_7_,local_f0[0x10]) + 1);
  }
  ::asio::detail::
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>(&local_80,0,0,*(io_context **)(local_1d8._0_8_ + 0x40));
  local_228._M_dataplus._M_p._0_4_ = 10;
  local_1c8._0_8_ = aaStack_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
  ::asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)local_f0,(protocol_type *)&local_228,server,
             (string *)local_1c8,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != aaStack_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(aaStack_1b8[0]._M_allocated_capacity + 1));
  }
  ::asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)local_1c8,
             (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)&local_80,(query *)local_f0);
  local_238 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_;
  sVar3 = *(size_type *)local_1c8._0_8_;
  lVar7 = aaStack_1b8[0]._M_allocated_capacity * 0x60;
  psVar1 = (size_type *)(sVar3 + 8 + lVar7);
  local_108 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*psVar1;
  pcStack_100 = (pointer)psVar1[1];
  if (*(short *)(sVar3 + lVar7) == 2) {
    aaStack_1b8[0]._8_4_ = 0;
    local_1c8._0_8_ = (ulong)*(uint *)(sVar3 + 4 + lVar7) << 0x20;
    local_1c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    aaStack_1b8[0]._M_allocated_capacity = (pointer)0x0;
  }
  else {
    aaStack_1b8[0]._8_4_ = *(undefined4 *)(sVar3 + 0x18 + lVar7);
    local_1c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    local_1c8._8_8_ = local_108;
    aaStack_1b8[0]._0_8_ = pcStack_100;
  }
  ::asio::ip::address::to_string_abi_cxx11_(&local_228,(address *)local_1c8);
  netif::getInterfaceAddresses_abi_cxx11_(&local_120,(netif *)0xa,family);
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_208._4_4_,10);
  ::asio::ip::host_name_abi_cxx11_();
  local_258._0_8_ = &aStack_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
  ::asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)local_1c8,(protocol_type *)&local_208,&local_288
             ,(string *)local_258,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._0_8_ != &aStack_248) {
    operator_delete((void *)local_258._0_8_,aStack_248._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  ::asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)&local_288,
             (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)&local_80,(query *)local_1c8);
  local_260 = __return_storage_ptr__;
  _Var12._M_p = local_288._M_dataplus._M_p;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._M_string_length;
  uVar8 = local_288.field_2._M_allocated_capacity;
  while (this = p_Var6,
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
    sVar3 = *(size_type *)_Var12._M_p;
    lVar7 = uVar8 * 0x60;
    puVar2 = (undefined8 *)(sVar3 + 8 + lVar7);
    local_208 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar2;
    sStack_200 = puVar2[1];
    if (*(short *)(sVar3 + lVar7) == 2) {
      local_258._0_8_ = (ulong)*(uint *)(sVar3 + 4 + lVar7) << 0x20;
      aStack_248._8_4_ = 0;
      local_258._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      aStack_248._M_allocated_capacity = 0;
    }
    else {
      aStack_248._8_4_ = *(undefined4 *)(sVar3 + 0x18 + lVar7);
      local_258._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      local_258._8_8_ = local_208;
      aStack_248._M_allocated_capacity = sStack_200;
    }
    ::asio::ip::address::to_string_abi_cxx11_(&local_288,(address *)local_258);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    uVar8 = uVar8 + 1;
    p_Var6 = this;
    if (uVar8 == ((long)(*(size_type *)((long)_Var12._M_p + 8) - *(size_type *)_Var12._M_p) >> 5) *
                 -0x5555555555555555) {
      _Var12._M_p = (pointer)0x0;
      uVar8 = 0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        _Var12._M_p = (pointer)0x0;
        uVar8 = 0;
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_120);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,&local_1f8);
  psVar5 = local_260;
  prioritizeExternalAddresses
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_258,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_138,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_150);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  local_230 = &psVar5->field_2;
  (psVar5->_M_dataplus)._M_p = (pointer)local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar5,*(size_type *)local_258._0_8_,
             *(long *)(local_258._0_8_ + 8) + *(size_type *)local_258._0_8_);
  uVar8 = local_258._8_8_;
  uVar11 = 0;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_258._0_8_;
  if (psVar5->_M_string_length != 0 && local_228._M_string_length != 0) {
    uVar9 = 0;
    while (*(char *)(CONCAT44(local_228._M_dataplus._M_p._4_4_,local_228._M_dataplus._M_p._0_4_) +
                    uVar9) == (psVar5->_M_dataplus)._M_p[uVar9]) {
      uVar11 = uVar9 + 1;
      if ((local_228._M_string_length - 1 == uVar9) ||
         (bVar14 = psVar5->_M_string_length - 1 == uVar9, uVar9 = uVar11, bVar14))
      goto joined_r0x00427cc8;
    }
    uVar11 = uVar9 & 0xffffffff;
  }
joined_r0x00427cc8:
  do {
    if (paVar4 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar8) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_258);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar5 = local_260;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188[1]._0_8_ != &local_168) {
        operator_delete((void *)local_188[1]._0_8_,(ulong)(local_168._M_allocated_capacity + 1));
      }
      p_Var6 = local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_head_impl != local_188) {
        operator_delete(local_198._M_head_impl,local_188[0]._M_allocated_capacity + 1);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1f8);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_228._M_dataplus._M_p._4_4_,local_228._M_dataplus._M_p._0_4_) !=
          &local_228.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_228._M_dataplus._M_p._4_4_,local_228._M_dataplus._M_p._0_4_),
                        local_228.field_2._M_allocated_capacity + 1);
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_p != &local_90) {
        operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != &local_b0) {
        operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      ::asio::detail::
      io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>::
      ~io_object_impl(&local_80);
      if ((element_type *)local_1d8._8_8_ != (element_type *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
      }
      return psVar5;
    }
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,paVar4->_M_allocated_capacity,
               (&paVar4->_M_allocated_capacity)[1] + paVar4->_M_allocated_capacity);
    puVar13 = (undefined1 *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 && local_228._M_string_length != 0) {
      puVar10 = (undefined1 *)0x0;
      while (puVar10[CONCAT44(local_228._M_dataplus._M_p._4_4_,local_228._M_dataplus._M_p._0_4_)] ==
             local_288._M_dataplus._M_p[(long)puVar10]) {
        puVar13 = puVar10 + 1;
        if (((undefined1 *)(local_228._M_string_length - 1) == puVar10) ||
           (bVar14 = (undefined1 *)
                     ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             (local_288._M_string_length + -0x10))->_M_weak_count + 3) == puVar10,
           puVar10 = puVar13, bVar14)) goto LAB_00427d3d;
      }
      puVar13 = (undefined1 *)((ulong)puVar10 & 0xffffffff);
    }
LAB_00427d3d:
    if (6 < (int)puVar13 && (int)uVar11 < (int)puVar13) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288);
      uVar11 = (ulong)puVar13 & 0xffffffff;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar4->_M_allocated_capacity + 4);
  } while( true );
}

Assistant:

std::string getLocalExternalAddressV6(const std::string& server)
{
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = gmlc::networking::AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());

    asio::ip::tcp::resolver::query query_server(
        asio::ip::tcp::v6(), server, "");
    asio::ip::tcp::resolver::iterator it_server =
        resolver.resolve(query_server);
    asio::ip::tcp::endpoint servep = *it_server;
    asio::ip::tcp::resolver::iterator end;

    auto sstring = (it_server == end) ? server : servep.address().to_string();
#else
    std::string sstring = server;
#endif
    auto interface_addresses = gmlc::netif::getInterfaceAddressesV6();
    std::vector<std::string> resolved_addresses;
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v6(), asio::ip::host_name(), "");
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query);
    // asio::ip::tcp::endpoint endpoint = *it;

    while (it != end) {
        asio::ip::tcp::endpoint ept = *it;
        resolved_addresses.push_back(ept.address().to_string());
        ++it;
    }
#endif
    auto candidate_addresses =
        prioritizeExternalAddresses(interface_addresses, resolved_addresses);

    int cnt = 0;
    std::string def = candidate_addresses[0];
    cnt = matchcount(sstring.begin(), sstring.end(), def.begin(), def.end());
    for (auto ndef : candidate_addresses) {
        auto mcnt = matchcount(
            sstring.begin(), sstring.end(), ndef.begin(), ndef.end());
        if ((mcnt > cnt) && (mcnt >= 7)) {
            def = ndef;
            cnt = mcnt;
        }
    }
    return def;
}